

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O3

void __thiscall OjaNewton::compute_AZx(OjaNewton *this)

{
  float *pfVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  if (0 < this->m) {
    lVar3 = 1;
    do {
      (this->data).AZx[lVar3] = 0.0;
      lVar4 = 0;
      do {
        pfVar1 = (this->data).AZx;
        pfVar1[lVar3] = this->A[lVar3][lVar4 + 1] * (this->data).Zx[lVar4 + 1] + pfVar1[lVar3];
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
      bVar2 = lVar3 < this->m;
      lVar3 = lVar3 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void compute_AZx()
  {
    for (int i = 1; i <= m; i++)
    {
      data.AZx[i] = 0;
      for (int j = 1; j <= i; j++)
      {
        data.AZx[i] += A[i][j] * data.Zx[j];
      }
    }
  }